

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

bool cmMessageCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  undefined1 uVar3;
  bool bVar4;
  LogLevel LVar5;
  int iVar6;
  cmMakefile *this;
  allocator<char> local_16a;
  allocator<char> local_169;
  cmMakefile *local_168;
  string local_160;
  string message;
  long local_120;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"called with incorrect number of arguments",
               (allocator<char> *)&local_160);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&message);
  }
  else {
    this = status->Makefile;
    bVar2 = std::operator==(__lhs,"SEND_ERROR");
    iVar6 = 1;
    local_120 = 0x20;
    if ((!bVar2) && (bVar2 = std::operator==(__lhs,"FATAL_ERROR"), !bVar2)) {
      bVar2 = std::operator==(__lhs,"WARNING");
      iVar6 = 2;
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"AUTHOR_WARNING");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_169);
          local_168 = this;
          bVar4 = cmMakefile::IsSet(this,&message);
          bVar2 = false;
          if (bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_160,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_16a);
            bVar2 = cmMakefile::IsOn(local_168,&local_160);
            bVar2 = !bVar2;
            std::__cxx11::string::~string((string *)&local_160);
          }
          std::__cxx11::string::~string((string *)&message);
          if (bVar2) {
            iVar6 = 1;
            this = local_168;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                       (allocator<char> *)&local_160);
            this = local_168;
            bVar2 = cmMakefile::IsOn(local_168,&message);
            std::__cxx11::string::~string((string *)&message);
            if (bVar2) goto LAB_002bfc2e;
          }
        }
        else {
          bVar2 = std::operator==(__lhs,"CHECK_START");
          iVar6 = 4;
          if ((((!bVar2) && (bVar2 = std::operator==(__lhs,"CHECK_PASS"), !bVar2)) &&
              (bVar2 = std::operator==(__lhs,"CHECK_FAIL"), !bVar2)) &&
             (bVar2 = std::operator==(__lhs,"STATUS"), !bVar2)) {
            bVar2 = std::operator==(__lhs,"VERBOSE");
            if (bVar2) {
              iVar6 = 5;
            }
            else {
              bVar2 = std::operator==(__lhs,"DEBUG");
              if (bVar2) {
                iVar6 = 6;
              }
              else {
                bVar2 = std::operator==(__lhs,"TRACE");
                if (bVar2) {
                  iVar6 = 7;
                }
                else {
                  bVar2 = std::operator==(__lhs,"DEPRECATION");
                  if (bVar2) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&message,"CMAKE_ERROR_DEPRECATED",
                               (allocator<char> *)&local_160);
                    local_168 = this;
                    bVar2 = cmMakefile::IsOn(this,&message);
                    std::__cxx11::string::~string((string *)&message);
                    if (bVar2) {
                      iVar6 = 1;
                      this = local_168;
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&message,"CMAKE_WARN_DEPRECATED",&local_169);
                      bVar2 = cmMakefile::IsSet(local_168,&message);
                      if (bVar2) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_160,"CMAKE_WARN_DEPRECATED",&local_16a);
                        bVar2 = cmMakefile::IsOn(local_168,&local_160);
                        std::__cxx11::string::~string((string *)&local_160);
                        std::__cxx11::string::~string((string *)&message);
                        if (!bVar2) goto LAB_002bfc2e;
                        iVar6 = 2;
                        this = local_168;
                      }
                      else {
                        std::__cxx11::string::~string((string *)&message);
                        iVar6 = 2;
                        this = local_168;
                      }
                    }
                  }
                  else {
                    bVar2 = std::operator==(__lhs,"NOTICE");
                    local_120 = (ulong)bVar2 << 5;
                    iVar6 = 3;
                  }
                }
              }
            }
          }
        }
      }
    }
    LVar5 = cmMakefile::GetCurrentLogLevel(this);
    if (iVar6 <= (int)LVar5) {
      local_160._M_dataplus._M_p = (pointer)((long)&(__lhs->_M_dataplus)._M_p + local_120);
      local_160._M_string_length =
           (size_type)
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      cmJoin(&message,(cmStringRange *)&local_160,(string_view)(ZEXT816(0x61ebb9) << 0x40),
             (string_view)ZEXT816(0));
      uVar3 = (*(code *)(&DAT_005d9a24 + *(int *)(&DAT_005d9a24 + (ulong)(iVar6 - 1) * 4)))();
      return (bool)uVar3;
    }
  }
LAB_002bfc2e:
  return __lhs != pbVar1;
}

Assistant:

bool cmMessageCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto& mf = status.GetMakefile();

  auto i = args.cbegin();

  auto type = MessageType::MESSAGE;
  auto fatal = false;
  auto level = Message::LogLevel::LOG_UNDEFINED;
  auto checkingType = CheckingType::UNDEFINED;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    level = Message::LogLevel::LOG_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    level = Message::LogLevel::LOG_WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (mf.IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "CHECK_START") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_START;
    ++i;
  } else if (*i == "CHECK_PASS") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_PASS;
    ++i;
  } else if (*i == "CHECK_FAIL") {
    level = Message::LogLevel::LOG_STATUS;
    checkingType = CheckingType::CHECK_FAIL;
    ++i;
  } else if (*i == "STATUS") {
    level = Message::LogLevel::LOG_STATUS;
    ++i;
  } else if (*i == "VERBOSE") {
    level = Message::LogLevel::LOG_VERBOSE;
    ++i;
  } else if (*i == "DEBUG") {
    level = Message::LogLevel::LOG_DEBUG;
    ++i;
  } else if (*i == "TRACE") {
    level = Message::LogLevel::LOG_TRACE;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (mf.IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
      level = Message::LogLevel::LOG_ERROR;
    } else if (!mf.IsSet("CMAKE_WARN_DEPRECATED") ||
               mf.IsOn("CMAKE_WARN_DEPRECATED")) {
      type = MessageType::DEPRECATION_WARNING;
      level = Message::LogLevel::LOG_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "NOTICE") {
    // `NOTICE` message type is going to be output to stderr
    level = Message::LogLevel::LOG_NOTICE;
    ++i;
  } else {
    // Messages w/o any type are `NOTICE`s
    level = Message::LogLevel::LOG_NOTICE;
  }
  assert("Message log level expected to be set" &&
         level != Message::LogLevel::LOG_UNDEFINED);

  Message::LogLevel desiredLevel = mf.GetCurrentLogLevel();

  if (desiredLevel < level) {
    // Suppress the message
    return true;
  }

  auto message = cmJoin(cmMakeRange(i, args.cend()), "");

  switch (level) {
    case Message::LogLevel::LOG_ERROR:
    case Message::LogLevel::LOG_WARNING:
      // we've overridden the message type, above, so display it directly
      mf.GetMessenger()->DisplayMessage(type, message, mf.GetBacktrace());
      break;

    case Message::LogLevel::LOG_NOTICE:
      cmSystemTools::Message(IndentText(message, mf));
      break;

    case Message::LogLevel::LOG_STATUS:
      switch (checkingType) {
        case CheckingType::CHECK_START:
          mf.DisplayStatus(IndentText(message, mf), -1);
          mf.GetCMakeInstance()->PushCheckInProgressMessage(message);
          break;

        case CheckingType::CHECK_PASS:
          ReportCheckResult("CHECK_PASS"_s, message, mf);
          break;

        case CheckingType::CHECK_FAIL:
          ReportCheckResult("CHECK_FAIL"_s, message, mf);
          break;

        default:
          mf.DisplayStatus(IndentText(message, mf), -1);
          break;
      }
      break;

    case Message::LogLevel::LOG_VERBOSE:
    case Message::LogLevel::LOG_DEBUG:
    case Message::LogLevel::LOG_TRACE:
      mf.DisplayStatus(IndentText(message, mf), -1);
      break;

    default:
      assert("Unexpected log level! Review the `cmMessageCommand.cxx`." &&
             false);
      break;
  }

  if (fatal) {
    cmSystemTools::SetFatalErrorOccurred();
  }
  return true;
}